

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Set_Record_R_PDU.cpp
# Opt level: O3

void __thiscall
KDIS::PDU::Set_Record_R_PDU::Decode(Set_Record_R_PDU *this,KDataStream *stream,bool ignoreHeader)

{
  pointer pRVar1;
  pointer pRVar2;
  KUINT16 KVar3;
  KException *this_00;
  int iVar4;
  undefined7 in_register_00000011;
  uint uVar5;
  pointer pRVar6;
  RecordSet local_60;
  
  KVar3 = KDataStream::GetBufferSize(stream);
  iVar4 = 0xc;
  if ((int)CONCAT71(in_register_00000011,ignoreHeader) == 0) {
    iVar4 = 0;
  }
  if (iVar4 + (uint)KVar3 < 0x28) {
    this_00 = (KException *)__cxa_allocate_exception(0x30);
    local_60.super_DataTypeBase._vptr_DataTypeBase = (_func_int **)&local_60.m_ui16RecLen;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"Decode","");
    KException::KException(this_00,(KString *)&local_60,2);
    __cxa_throw(this_00,&KException::typeinfo,KException::~KException);
  }
  pRVar1 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_start;
  pRVar2 = (this->m_vRecs).
           super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pRVar6 = pRVar1;
  if (pRVar2 != pRVar1) {
    do {
      (**(pRVar6->super_DataTypeBase)._vptr_DataTypeBase)(pRVar6);
      pRVar6 = pRVar6 + 1;
    } while (pRVar6 != pRVar2);
    (this->m_vRecs).
    super__Vector_base<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>.
    _M_impl.super__Vector_impl_data._M_finish = pRVar1;
  }
  Simulation_Management_Header::Decode
            (&this->super_Simulation_Management_Header,stream,ignoreHeader);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32RqId);
  KDataStream::Read(stream,&(this->super_Reliability_Header).m_ui8ReqRelSrv);
  KDataStream::Read(stream,&this->m_ui8Padding1);
  KDataStream::Read<unsigned_short>(stream,&this->m_ui16Padding);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32Padding);
  KDataStream::Read<unsigned_int>(stream,&this->m_ui32NumRecSets);
  if (this->m_ui32NumRecSets != 0) {
    uVar5 = 0;
    do {
      DATA_TYPE::RecordSet::RecordSet(&local_60,stream);
      std::vector<KDIS::DATA_TYPE::RecordSet,_std::allocator<KDIS::DATA_TYPE::RecordSet>_>::
      emplace_back<KDIS::DATA_TYPE::RecordSet>(&this->m_vRecs,&local_60);
      DATA_TYPE::RecordSet::~RecordSet(&local_60);
      uVar5 = uVar5 + 1;
    } while (uVar5 < this->m_ui32NumRecSets);
  }
  return;
}

Assistant:

void Set_Record_R_PDU::Decode(KDataStream &stream, bool ignoreHeader /*= true*/ ) noexcept(false)
{
    if( ( stream.GetBufferSize() + ( ignoreHeader ? Header::HEADER6_PDU_SIZE : 0 ) ) < SET_RECORD_R_PDU_SIZE )throw KException( __FUNCTION__, NOT_ENOUGH_DATA_IN_BUFFER );

    m_vRecs.clear();

    Simulation_Management_Header::Decode( stream, ignoreHeader );

    stream >> m_ui32RqId
           >> m_ui8ReqRelSrv
           >> m_ui8Padding1
           >> m_ui16Padding
           >> m_ui32Padding
           >> m_ui32NumRecSets;

    for( KUINT32 i = 0; i < m_ui32NumRecSets; ++i )
    {
        m_vRecs.push_back( RecordSet( stream ) );
    }
}